

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O3

void toggle_save(t_gobj *z,_binbuf *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  t_symbol *ptVar9;
  t_symbol *ptVar10;
  t_symbol *ptVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar12;
  t_symbol *srl [3];
  t_symbol *bflcol [3];
  
  iemgui_save((t_iemgui *)z,srl,bflcol);
  ptVar9 = gensym("#X");
  ptVar10 = gensym("obj");
  sVar1 = *(short *)&z[2].g_next;
  sVar2 = *(short *)((long)&z[2].g_next + 2);
  ptVar11 = gensym("tgl");
  iVar3 = *(int *)((long)&z[4].g_pd + 4);
  iVar4 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  iVar7 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  uVar5 = *(uint *)&z[5].g_pd;
  uVar6 = *(uint *)((long)&z[5].g_pd + 4);
  iVar8 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  dVar12 = 0.0;
  if (((ulong)z[0x44].g_next & 1) != 0) {
    dVar12 = (double)*(float *)&z[0x49].g_pd;
  }
  binbuf_addv(b,"ssiisiisssiiiisssff",dVar12,(double)*(float *)((long)&z[0x49].g_pd + 4),ptVar9,
              ptVar10,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar2,ptVar11,
              (long)iVar3 / (long)iVar4 & 0xffffffff,CONCAT44(extraout_var,iVar7),srl[0],srl[1],
              srl[2],(ulong)uVar5,(ulong)uVar6,CONCAT44(extraout_var_00,iVar8),
              (ulong)*(uint *)((long)&z[0x44].g_pd + 4),bflcol[0],bflcol[1],bflcol[2]);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void toggle_save(t_gobj *z, t_binbuf *b)
{
    t_toggle *x = (t_toggle *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    iemgui_save(&x->x_gui, srl, bflcol);
    binbuf_addv(b, "ssiisiisssiiiisssff", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix,
                (int)x->x_gui.x_obj.te_ypix,
                gensym("tgl"), x->x_gui.x_w/IEMGUI_ZOOM(x),
                iem_symargstoint(&x->x_gui.x_isa),
                srl[0], srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[1], bflcol[2],
                x->x_gui.x_isa.x_loadinit?x->x_on:0.f,
                x->x_nonzero);
    binbuf_addv(b, ";");
}